

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-all.c
# Opt level: O1

void tb_flush_jmp_cache_arm(CPUState *cpu,target_ulong_conflict addr)

{
  uc_struct_conflict7 *puVar1;
  TargetPageBits *pTVar2;
  byte bVar3;
  uint uVar4;
  
  puVar1 = cpu->uc;
  pTVar2 = puVar1->init_target_page;
  uVar4 = pTVar2->mask + addr;
  bVar3 = (char)pTVar2->bits - 6;
  memset((void *)((long)cpu->tb_jmp_cache +
                 (ulong)(((uVar4 >> (bVar3 & 0x1f) ^ uVar4) >> (bVar3 & 0x1f) & 0xfc0) << 3)),0,
         0x200);
  bVar3 = (char)puVar1->init_target_page->bits - 6;
  memset((void *)((long)cpu->tb_jmp_cache +
                 (ulong)(((addr >> (bVar3 & 0x1f) ^ addr) >> (bVar3 & 0x1f) & 0xfc0) << 3)),0,0x200)
  ;
  return;
}

Assistant:

void tb_flush_jmp_cache(CPUState *cpu, target_ulong addr)
{
#ifdef TARGET_ARM
    struct uc_struct *uc = cpu->uc;
#endif

    /* Discard jump cache entries for any tb which might potentially
       overlap the flushed page.  */
    tb_jmp_cache_clear_page(cpu, addr - TARGET_PAGE_SIZE);
    tb_jmp_cache_clear_page(cpu, addr);
}